

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortran::CopyModule
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  string local_168;
  string local_148;
  undefined1 local_128 [8];
  string mod_lower;
  string local_e8;
  undefined1 local_c8 [8];
  string mod_upper;
  string mod_dir;
  string compilerId;
  undefined1 local_58 [8];
  string stamp;
  string mod;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)(stamp.field_2._M_local_buf + 8),(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  std::__cxx11::string::string((string *)local_58,(string *)pvVar2);
  std::__cxx11::string::string((string *)(mod_dir.field_2._M_local_buf + 8));
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (4 < sVar3) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,4);
    std::__cxx11::string::operator=((string *)(mod_dir.field_2._M_local_buf + 8),(string *)pvVar2);
  }
  cmsys::SystemTools::GetFilenamePath
            ((string *)((long)&mod_upper.field_2 + 8),(string *)((long)&stamp.field_2 + 8));
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)(mod_upper.field_2._M_local_buf + 8),"/");
  }
  std::__cxx11::string::string((string *)local_c8,(string *)(mod_upper.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetFilenameName
            ((string *)((long)&mod_lower.field_2 + 8),(string *)((long)&stamp.field_2 + 8));
  cmsys::SystemTools::UpperCase(&local_e8,(string *)((long)&mod_lower.field_2 + 8));
  std::__cxx11::string::operator+=((string *)local_c8,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)(mod_lower.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_128,(string *)(mod_upper.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetFilenameName(&local_168,(string *)((long)&stamp.field_2 + 8));
  cmsys::SystemTools::LowerCase(&local_148,&local_168);
  std::__cxx11::string::operator+=((string *)local_128,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::operator+=((string *)(stamp.field_2._M_local_buf + 8),".mod");
  std::__cxx11::string::operator+=((string *)local_c8,".mod");
  std::__cxx11::string::operator+=((string *)local_128,".mod");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar5,true);
  if (bVar1) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bVar1 = ModulesDiffer(pcVar5,pcVar6,pcVar7);
    if ((!bVar1) ||
       (bVar1 = cmsys::SystemTools::CopyFileAlways((string *)local_c8,(string *)local_58), bVar1)) {
      args_local._7_1_ = true;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
      poVar8 = std::operator<<(poVar8,(string *)local_c8);
      poVar8 = std::operator<<(poVar8,"\" to \"");
      poVar8 = std::operator<<(poVar8,(string *)local_58);
      std::operator<<(poVar8,"\".\n");
      args_local._7_1_ = false;
    }
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar5,true);
    if (bVar1) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      bVar1 = ModulesDiffer(pcVar5,pcVar6,pcVar7);
      if ((!bVar1) ||
         (bVar1 = cmsys::SystemTools::CopyFileAlways((string *)local_128,(string *)local_58), bVar1)
         ) {
        args_local._7_1_ = true;
      }
      else {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module from \"");
        poVar8 = std::operator<<(poVar8,(string *)local_128);
        poVar8 = std::operator<<(poVar8,"\" to \"");
        poVar8 = std::operator<<(poVar8,(string *)local_58);
        std::operator<<(poVar8,"\".\n");
        args_local._7_1_ = false;
      }
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error copying Fortran module \"");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      poVar8 = std::operator<<(poVar8,(string *)pvVar2);
      poVar8 = std::operator<<(poVar8,"\".  Tried \"");
      poVar8 = std::operator<<(poVar8,(string *)local_c8);
      poVar8 = std::operator<<(poVar8,"\" and \"");
      poVar8 = std::operator<<(poVar8,(string *)local_128);
      std::operator<<(poVar8,"\".\n");
      args_local._7_1_ = false;
    }
  }
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)(mod_upper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(mod_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(stamp.field_2._M_local_buf + 8));
  return args_local._7_1_;
}

Assistant:

bool cmDependsFortran::CopyModule(const std::vector<std::string>& args)
{
  // Implements
  //
  //   $(CMAKE_COMMAND) -E cmake_copy_f90_mod input.mod output.mod.stamp
  //                                          [compiler-id]
  //
  // Note that the case of the .mod file depends on the compiler.  In
  // the future this copy could also account for the fact that some
  // compilers include a timestamp in the .mod file so it changes even
  // when the interface described in the module does not.

  std::string mod = args[2];
  std::string stamp = args[3];
  std::string compilerId;
  if (args.size() >= 5) {
    compilerId = args[4];
  }
  std::string mod_dir = cmSystemTools::GetFilenamePath(mod);
  if (!mod_dir.empty()) {
    mod_dir += "/";
  }
  std::string mod_upper = mod_dir;
  mod_upper += cmSystemTools::UpperCase(cmSystemTools::GetFilenameName(mod));
  std::string mod_lower = mod_dir;
  mod_lower += cmSystemTools::LowerCase(cmSystemTools::GetFilenameName(mod));
  mod += ".mod";
  mod_upper += ".mod";
  mod_lower += ".mod";
  if (cmSystemTools::FileExists(mod_upper.c_str(), true)) {
    if (cmDependsFortran::ModulesDiffer(mod_upper.c_str(), stamp.c_str(),
                                        compilerId.c_str())) {
      if (!cmSystemTools::CopyFileAlways(mod_upper, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_upper
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }
  if (cmSystemTools::FileExists(mod_lower.c_str(), true)) {
    if (cmDependsFortran::ModulesDiffer(mod_lower.c_str(), stamp.c_str(),
                                        compilerId.c_str())) {
      if (!cmSystemTools::CopyFileAlways(mod_lower, stamp)) {
        std::cerr << "Error copying Fortran module from \"" << mod_lower
                  << "\" to \"" << stamp << "\".\n";
        return false;
      }
    }
    return true;
  }

  std::cerr << "Error copying Fortran module \"" << args[2] << "\".  Tried \""
            << mod_upper << "\" and \"" << mod_lower << "\".\n";
  return false;
}